

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QColorListModel.cpp
# Opt level: O2

void __thiscall QColorListModel::setNameFormat(QColorListModel *this,NameFormat nameFormat)

{
  int iVar1;
  QArrayDataPointer<int> local_98;
  QModelIndex local_80;
  undefined1 local_68 [24];
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  this->d->nameFormat = nameFormat;
  local_80.r = -1;
  local_80.c = -1;
  local_80.i = 0;
  local_80.m = (QAbstractItemModel *)0x0;
  iVar1 = (**(code **)(*(long *)this + 0x78))();
  if (0 < iVar1) {
    local_20 = 0xffffffffffffffff;
    local_18 = 0;
    uStack_10 = 0;
    (**(code **)(*(long *)this + 0x60))(&local_80,this,0,0);
    local_38 = 0xffffffffffffffff;
    local_30 = 0;
    uStack_28 = 0;
    iVar1 = (**(code **)(*(long *)this + 0x78))(this);
    local_50 = 0xffffffffffffffff;
    local_48 = 0;
    uStack_40 = 0;
    (**(code **)(*(long *)this + 0x60))(local_68,this,iVar1 + -1,0);
    local_98.d = (Data *)0x0;
    local_98.ptr = (int *)0x0;
    local_98.size = 0;
    QList<int>::append((QList<int> *)&local_98,0);
    QAbstractItemModel::dataChanged((QModelIndex *)this,&local_80,(QList *)local_68);
    QArrayDataPointer<int>::~QArrayDataPointer(&local_98);
  }
  return;
}

Assistant:

void QColorListModel::setNameFormat(QColorListModel::NameFormat nameFormat) {
    d->nameFormat = nameFormat;

    if (rowCount() > 0) {
        Q_EMIT dataChanged(index(0, 0), index(rowCount() - 1, 0), QVector<int>() << Qt::DisplayRole);
    }
}